

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O0

uint32_t __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::hash32
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,uint32_t seed)

{
  XXH32_hash_t XVar1;
  void *input;
  size_t in_RDI;
  size_t size;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_ffffffffffffffe0;
  
  input = (void *)byteSize(in_stack_ffffffffffffffe0);
  start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x11c463);
  XVar1 = VELOCYPACK_XXH32(input,in_RDI,0);
  return XVar1;
}

Assistant:

inline uint32_t hash32(uint32_t seed = defaultSeed32) const {
    size_t const size = checkOverflow(byteSize());
    return VELOCYPACK_HASH32(start(), size, seed);
  }